

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Processor * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,Processor *p)

{
  Processor *pPVar1;
  Processor *result;
  pool_ptr<soul::AST::ModuleBase> local_20;
  pool_ptr<soul::AST::ModuleBase> lastModule;
  Processor *p_local;
  QualifiedIdentifierResolver *this_local;
  
  local_20.object = (this->currentModule).object;
  lastModule.object = (ModuleBase *)p;
  pool_ptr<soul::AST::ModuleBase>::pool_ptr<soul::AST::Processor,void>
            ((pool_ptr<soul::AST::ModuleBase> *)&result,p);
  (this->currentModule).object = (ModuleBase *)result;
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr((pool_ptr<soul::AST::ModuleBase> *)&result);
  pPVar1 = ModuleInstanceResolver::visit
                     (&this->super_ModuleInstanceResolver,(Processor *)lastModule.object);
  (this->currentModule).object = local_20.object;
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_20);
  return pPVar1;
}

Assistant:

AST::Processor& visit (AST::Processor& p) override
        {
            auto lastModule = currentModule;
            currentModule = p;
            auto& result = ModuleInstanceResolver::visit (p);
            currentModule = lastModule;
            return result;
        }